

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

void __thiscall xLearn::Checker::Initialize(Checker *this,bool is_train,int argc,char **argv)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long in_RCX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int i;
  value_type *in_stack_fffffffffffff7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff7b0;
  allocator local_5e9;
  string local_5e8 [32];
  int local_5c8;
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  long local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  *(byte *)(in_RDI + 0x30) = local_9;
  local_18 = in_RCX;
  local_10 = in_EDX;
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,"-o",&local_4a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"-l",&local_4d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"-nthread",&local_4f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"-block",&local_521);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_548,"--sign",&local_549);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"--sigmoid",&local_571);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_598,"--disk",&local_599);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"--no-norm",&local_5c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"-s",&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"-x",&local_71);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"-v",&local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"-p",&local_c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"-m",&local_e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"-t",&local_111);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"-l",&local_139);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"-k",&local_161);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"-r",&local_189);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"-b",&local_1b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"-u",&local_1d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"-e",&local_201);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"-f",&local_229);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"-pre",&local_251);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"-nthread",&local_279);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"-block",&local_2a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"-sw",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"-seed",&local_2f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_318,"--disk",&local_319);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"--cv",&local_341);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"--dis-es",&local_369);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"--no-norm",&local_391);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"--no-bin",&local_3b9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"--quiet",&local_3e1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,"-alpha",&local_409);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"-beta",&local_431);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"-lambda_1",&local_459);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"-lambda_2",&local_481);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  for (local_5c8 = 0; local_5c8 < local_10; local_5c8 = local_5c8 + 1) {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RDI + 0x18);
    pcVar1 = *(char **)(local_18 + (long)local_5c8 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,pcVar1,&local_5e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,in_stack_fffffffffffff7a8);
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  }
  return;
}

Assistant:

void Checker::Initialize(bool is_train, int argc, char* argv[]) {
  is_train_ = is_train;
  if (is_train_) {  // for training
    menu_.push_back(std::string("-s"));
    menu_.push_back(std::string("-x"));
    menu_.push_back(std::string("-v"));
    menu_.push_back(std::string("-p"));
    menu_.push_back(std::string("-m"));
    menu_.push_back(std::string("-t"));
    menu_.push_back(std::string("-l"));
    menu_.push_back(std::string("-k"));
    menu_.push_back(std::string("-r"));
    menu_.push_back(std::string("-b"));
    menu_.push_back(std::string("-u"));
    menu_.push_back(std::string("-e"));
    menu_.push_back(std::string("-f"));
    menu_.push_back(std::string("-pre"));
    menu_.push_back(std::string("-nthread"));
    menu_.push_back(std::string("-block"));
    menu_.push_back(std::string("-sw"));
    menu_.push_back(std::string("-seed"));
    menu_.push_back(std::string("--disk"));
    menu_.push_back(std::string("--cv"));
    menu_.push_back(std::string("--dis-es"));
    menu_.push_back(std::string("--no-norm"));
    menu_.push_back(std::string("--no-bin"));
    menu_.push_back(std::string("--quiet"));
    menu_.push_back(std::string("-alpha"));
    menu_.push_back(std::string("-beta"));
    menu_.push_back(std::string("-lambda_1"));
    menu_.push_back(std::string("-lambda_2"));
  } else {  // for Prediction
    menu_.push_back(std::string("-o"));
    menu_.push_back(std::string("-l"));
    menu_.push_back(std::string("-nthread"));
    menu_.push_back(std::string("-block"));
    menu_.push_back(std::string("--sign"));
    menu_.push_back(std::string("--sigmoid"));
    menu_.push_back(std::string("--disk"));
    menu_.push_back(std::string("--no-norm"));
  }
  // Get the user's input
  for (int i = 0; i < argc; ++i) {
    args_.push_back(std::string(argv[i]));
  }
}